

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteLong1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,int64 C1)

{
  Data *this_00;
  bool bVar1;
  undefined2 local_1a;
  undefined1 auStack_18 [6];
  OpLayoutT_Long1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((DAT_015b5fbd == '\0') && (local_1a = (undefined2)R0, R0 < 0x10000)) {
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    _auStack_18 = C1;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,&local_1a,10);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteLong1Const1(OpCodeAsmJs op, RegSlot R0, int64 C1)
    {
        OpLayoutT_Long1Const1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.L0, R0) && SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }